

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  ImVec2 IVar8;
  undefined1 extraout_var [12];
  undefined1 auVar9 [16];
  float fVar10;
  ImVec2 size_auto_fit;
  ImVec2 size_desired;
  ImVec2 local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ImVec2 local_50;
  ImVec2 local_48;
  float local_38;
  float fStack_34;
  undefined8 uStack_30;
  ImVec2 local_20;
  
  pIVar2 = GImGui;
  local_68 = ImGuiWindow::TitleBarHeight(window);
  fVar7 = ImGuiWindow::MenuBarHeight(window);
  uStack_64 = extraout_var._0_4_;
  uStack_60 = extraout_var._4_4_;
  uStack_5c = extraout_var._8_4_;
  local_68 = fVar7 + local_68;
  local_38 = (window->WindowPadding).x;
  fStack_34 = (window->WindowPadding).y;
  local_38 = local_38 + local_38;
  fStack_34 = fStack_34 + fStack_34;
  local_70.x = (*size_contents).x + local_38 + 0.0;
  local_70.y = local_68 + (*size_contents).y + fStack_34;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    local_20 = (pIVar2->Style).WindowMinSize;
    auVar9._8_8_ = 0;
    auVar9._0_4_ = local_20.x;
    auVar9._4_4_ = local_20.y;
    uStack_30 = 0;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar9 = minps(auVar9,_DAT_0022a920);
      local_20 = auVar9._0_8_;
    }
    IVar8 = ((*(GImGui->Viewports).Data)->super_ImGuiViewport).WorkSize;
    IVar1 = (pIVar2->Style).DisplaySafeAreaPadding;
    fVar10 = IVar1.x;
    fVar7 = IVar1.y;
    fVar10 = IVar8.x - (fVar10 + fVar10);
    fVar7 = IVar8.y - (fVar7 + fVar7);
    uVar5 = -(uint)(fVar10 <= local_20.x);
    uVar6 = -(uint)(fVar7 <= local_20.y);
    local_50 = local_70;
    local_70 = ImClamp(&local_50,&local_20,
                       (ImVec2)(CONCAT44(~uVar6 & (uint)fVar7,~uVar5 & (uint)fVar10) |
                               CONCAT44((uint)local_20.y & uVar6,(uint)local_20.x & uVar5)));
    local_48 = local_70;
    IVar8 = CalcWindowSizeAfterConstraint(window,&local_70);
    uVar5 = window->Flags;
    bVar3 = 1;
    cVar4 = '\x01';
    if (size_contents->x <= IVar8.x - local_38 || (uVar5 & 0x808) != 0x800) {
      cVar4 = (char)((uVar5 & 0xffff) >> 0xf);
    }
    if (size_contents->y <= (IVar8.y - fStack_34) - local_68 || (uVar5 & 8) != 0) {
      bVar3 = (byte)(uVar5 >> 0xe) & 1;
    }
    if (cVar4 != '\0') {
      local_70.y = local_48.y + (pIVar2->Style).ScrollbarSize;
    }
    if (bVar3 != 0) {
      local_70.x = local_48.x + (pIVar2->Style).ScrollbarSize;
    }
  }
  return local_70;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + ImVec2(0.0f, decoration_up_height);
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        ImVec2 avail_size = ImGui::GetMainViewport()->WorkSize;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - 0.0f                 < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - decoration_up_height < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}